

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O3

ly_bool lyds_is_supported(lyd_node *node)

{
  lysc_node *plVar1;
  
  plVar1 = node->schema;
  if ((plVar1 != (lysc_node *)0x0) && ((char)plVar1->flags < '\0')) {
    if (plVar1->nodetype == 8) {
      return '\x01';
    }
    if ((plVar1->nodetype == 0x10) && ((plVar1->flags >> 9 & 1) == 0)) {
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

ly_bool
lyds_is_supported(const struct lyd_node *node)
{
    if (!node->schema || !(node->schema->flags & LYS_ORDBY_SYSTEM)) {
        return 0;
    } else if (node->schema->nodetype == LYS_LEAFLIST) {
        return 1;
    } else if ((node->schema->nodetype == LYS_LIST) && !(node->schema->flags & LYS_KEYLESS)) {
        return 1;
    } else {
        return 0;
    }
}